

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int ly_set_rm(ly_set *set,void *node)

{
  int iVar1;
  ulong uVar2;
  LY_ERR *pLVar3;
  
  if (node != (void *)0x0 && set != (ly_set *)0x0) {
    for (uVar2 = 0; set->number != uVar2; uVar2 = uVar2 + 1) {
      if ((set->set).s[uVar2] == (lys_node *)node) {
        if (set->number != (uint)uVar2) {
          iVar1 = ly_set_rm_index(set,(uint)uVar2);
          return iVar1;
        }
        break;
      }
    }
  }
  pLVar3 = ly_errno_location();
  *pLVar3 = LY_EINVAL;
  return 1;
}

Assistant:

API int
ly_set_rm(struct ly_set *set, void *node)
{
    unsigned int i;

    if (!set || !node) {
        ly_errno = LY_EINVAL;
        return EXIT_FAILURE;
    }

    /* get index */
    for (i = 0; i < set->number; i++) {
        if (set->set.g[i] == node) {
            break;
        }
    }
    if (i == set->number) {
        /* node is not in set */
        ly_errno = LY_EINVAL;
        return EXIT_FAILURE;
    }

    return ly_set_rm_index(set, i);
}